

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::color4f>
          (Attribute *this,double t,color4f *dst,TimeSampleInterpolationType tinterp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  value_type *pvVar5;
  optional<tinyusdz::value::color4f> v;
  optional<tinyusdz::value::color4f> local_50;
  optional<tinyusdz::value::color4f> local_3c;
  
  if (dst == (color4f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar4 = primvar::PrimVar::has_value(&this->_var);
    if (bVar4) {
      primvar::PrimVar::get_value<tinyusdz::value::color4f>(&local_50,&this->_var);
      local_3c.has_value_ = local_50.has_value_;
      if (local_50.has_value_ != false) {
        local_3c.contained._0_8_ = local_50.contained._0_8_;
        local_3c.contained._8_8_ = local_50.contained._8_8_;
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::value::color4f>::value(&local_3c);
        fVar1 = pvVar5->g;
        fVar2 = pvVar5->b;
        fVar3 = pvVar5->a;
        dst->r = pvVar5->r;
        dst->g = fVar1;
        dst->b = fVar2;
        dst->a = fVar3;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar4 = get_value<tinyusdz::value::color4f>(this,dst);
  }
  else {
    bVar4 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::color4f>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar4;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }